

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_test.cpp
# Opt level: O2

void ultimateTest(void)

{
  uint __line;
  Model *this;
  System *t;
  System *t_00;
  System *t_01;
  System *s;
  System *t_02;
  char *__assertion;
  double dVar1;
  allocator local_111;
  string local_110 [32];
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this = (Model *)Model::createModel();
  std::__cxx11::string::string(local_110,"sys1",&local_111);
  t = (System *)(**(code **)(*(long *)this + 0x50))(0x4059000000000000,this,local_110);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::string(local_110,"sys2",&local_111);
  t_00 = (System *)(**(code **)(*(long *)this + 0x50))(0,this,local_110);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::string(local_110,"sys3",&local_111);
  t_01 = (System *)(**(code **)(*(long *)this + 0x50))(0x4059000000000000,this,local_110);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::string(local_110,"sys4",&local_111);
  s = (System *)(**(code **)(*(long *)this + 0x50))(0,this,local_110);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::string(local_110,"sys5",&local_111);
  t_02 = (System *)(**(code **)(*(long *)this + 0x50))(0,this,local_110);
  std::__cxx11::string::~string(local_110);
  std::__cxx11::string::string((string *)&local_50,"exp1",(allocator *)local_110);
  Model::createFlow<FlowExp>(this,&local_50,s,t);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_70,"exp2",(allocator *)local_110);
  Model::createFlow<FlowExp>(this,&local_70,t,t_00);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string((string *)&local_90,"exp3",(allocator *)local_110);
  Model::createFlow<FlowExp>(this,&local_90,t,t_01);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string((string *)&local_b0,"exp4",(allocator *)local_110);
  Model::createFlow<FlowExp>(this,&local_b0,t_00,t_01);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_d0,"exp5",(allocator *)local_110);
  Model::createFlow<FlowExp>(this,&local_d0,t_01,s);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_f0,"exp6",(allocator *)local_110);
  Model::createFlow<FlowExp>(this,&local_f0,t_00,t_02);
  std::__cxx11::string::~string((string *)&local_f0);
  (*(code *)**(undefined8 **)this)(this,0,100);
  dVar1 = (double)(**(code **)(*(long *)t + 8))(t);
  if (0.0001 <= ABS(dVar1 + -31.8513)) {
    __assertion = "fabs(q1->getValue() - 31.8513) < 0.0001";
    __line = 0x2d;
  }
  else {
    dVar1 = (double)(**(code **)(*(long *)t_00 + 8))(t_00);
    if (0.0001 <= ABS(dVar1 + -18.4003)) {
      __assertion = "fabs(q2->getValue() - 18.4003) < 0.0001";
      __line = 0x2e;
    }
    else {
      dVar1 = (double)(**(code **)(*(long *)t_01 + 8))(t_01);
      if (0.0001 <= ABS(dVar1 + -77.1143)) {
        __assertion = "fabs(q3->getValue() - 77.1143) < 0.0001";
        __line = 0x2f;
      }
      else {
        dVar1 = (double)(**(code **)(*(long *)s + 8))(s);
        if (0.0001 <= ABS(dVar1 + -56.1728)) {
          __assertion = "fabs(q4->getValue() - 56.1728) < 0.0001";
          __line = 0x30;
        }
        else {
          dVar1 = (double)(**(code **)(*(long *)t_02 + 8))(t_02);
          if (ABS(dVar1 + -16.4612) < 0.0001) {
            return;
          }
          __assertion = "fabs(q5->getValue() - 16.4612) < 0.0001";
          __line = 0x31;
        }
      }
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/mrlucasrib[P]MyVensim-Simulator/test/functional_tests/func_test.cpp"
                ,__line,"void ultimateTest()");
}

Assistant:

void ultimateTest(){
    auto *m = Model::createModel();
    auto *q1 = m->createSystem("sys1",100);
    auto *q2 = m->createSystem("sys2",0.0);
    auto *q3 = m->createSystem("sys3",100);
    auto *q4 = m->createSystem("sys4",0.0);
    auto *q5 = m->createSystem("sys5",0.0);
    m->createFlow<FlowExp>("exp1", q4, q1);
    m->createFlow<FlowExp>("exp2", q1, q2);
    m->createFlow<FlowExp>("exp3", q1, q3);
    m->createFlow<FlowExp>("exp4", q2, q3);
    m->createFlow<FlowExp>("exp5", q3, q4);
    m->createFlow<FlowExp>("exp6", q2, q5);


    m->execute(0, 100);

    assert(fabs(q1->getValue() - 31.8513) < 0.0001);
    assert(fabs(q2->getValue() - 18.4003) < 0.0001);
    assert(fabs(q3->getValue() - 77.1143) < 0.0001);
    assert(fabs(q4->getValue() - 56.1728) < 0.0001);
    assert(fabs(q5->getValue() - 16.4612) < 0.0001);

}